

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall
fmt::BasicFormatter<char,_fmt::ArgFormatter<char>_>::parse_arg_index
          (Arg *__return_storage_ptr__,BasicFormatter<char,_fmt::ArgFormatter<char>_> *this,Char **s
          )

{
  uint arg_index;
  FormatError *this_00;
  char *local_60;
  CStringRef local_28;
  char *local_20;
  char *error;
  Char **s_local;
  BasicFormatter<char,_fmt::ArgFormatter<char>_> *this_local;
  
  local_20 = (char *)0x0;
  error = (char *)s;
  s_local = (Char **)this;
  if ((**s < '0') || ('9' < **s)) {
    internal::FormatterBase::next_arg(__return_storage_ptr__,&this->super_FormatterBase,&local_20);
  }
  else {
    arg_index = internal::parse_nonnegative_int<char>(s);
    internal::FormatterBase::get_arg
              (__return_storage_ptr__,&this->super_FormatterBase,arg_index,&local_20);
  }
  if (local_20 != (char *)0x0) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    if ((**(char **)error == '}') || (**(char **)error == ':')) {
      local_60 = local_20;
    }
    else {
      local_60 = "invalid format string";
    }
    BasicCStringRef<char>::BasicCStringRef(&local_28,local_60);
    FormatError::FormatError(this_00,local_28);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return __return_storage_ptr__;
}

Assistant:

inline internal::Arg BasicFormatter<Char, AF>::parse_arg_index(const Char *&s)
{
    const char *error = FMT_NULL;
    internal::Arg arg = *s < '0' || *s > '9' ? next_arg(error) : get_arg(internal::parse_nonnegative_int(s), error);
    if (error)
    {
        FMT_THROW(FormatError(*s != '}' && *s != ':' ? "invalid format string" : error));
    }
    return arg;
}